

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O1

void cuddFreeTable(DdManager *unique)

{
  DdNode *__ptr;
  DdNode *pDVar1;
  void *pvVar2;
  DdNode **__ptr_00;
  long lVar3;
  long lVar4;
  
  __ptr = (DdNode *)unique->memoryList;
  if (unique->univ != (DdNode **)0x0) {
    cuddZddFreeUniv(unique);
  }
  while (__ptr != (DdNode *)0x0) {
    pDVar1 = *(DdNode **)__ptr;
    free(__ptr);
    __ptr = pDVar1;
  }
  unique->memoryList = (DdNode **)0x0;
  unique->nextFree = (DdNode *)0x0;
  if (0 < unique->size) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      pvVar2 = *(void **)((long)&unique->subtables->nodelist + lVar3);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)&unique->subtables->nodelist + lVar3) = 0;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x38;
    } while (lVar4 < unique->size);
  }
  if (0 < unique->sizeZ) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      pvVar2 = *(void **)((long)&unique->subtableZ->nodelist + lVar3);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)&unique->subtableZ->nodelist + lVar3) = 0;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x38;
    } while (lVar4 < unique->sizeZ);
  }
  __ptr_00 = (unique->constants).nodelist;
  if (__ptr_00 != (DdNode **)0x0) {
    free(__ptr_00);
    (unique->constants).nodelist = (DdNode **)0x0;
  }
  if (unique->subtables != (DdSubtable *)0x0) {
    free(unique->subtables);
    unique->subtables = (DdSubtable *)0x0;
  }
  if (unique->subtableZ != (DdSubtable *)0x0) {
    free(unique->subtableZ);
    unique->subtableZ = (DdSubtable *)0x0;
  }
  if (unique->acache != (DdCache *)0x0) {
    free(unique->acache);
    unique->acache = (DdCache *)0x0;
  }
  if (unique->perm != (int *)0x0) {
    free(unique->perm);
    unique->perm = (int *)0x0;
  }
  if (unique->permZ != (int *)0x0) {
    free(unique->permZ);
    unique->permZ = (int *)0x0;
  }
  if (unique->invperm != (int *)0x0) {
    free(unique->invperm);
    unique->invperm = (int *)0x0;
  }
  if (unique->invpermZ != (int *)0x0) {
    free(unique->invpermZ);
    unique->invpermZ = (int *)0x0;
  }
  if (unique->vars != (DdNode **)0x0) {
    free(unique->vars);
    unique->vars = (DdNode **)0x0;
  }
  if (unique->map != (int *)0x0) {
    free(unique->map);
    unique->map = (int *)0x0;
  }
  if (unique->stack != (DdNode **)0x0) {
    free(unique->stack);
    unique->stack = (DdNode **)0x0;
  }
  if (unique->deathRow != (DdNode **)0x0) {
    free(unique->deathRow);
    unique->deathRow = (DdNode **)0x0;
  }
  if (unique->tree != (MtrNode *)0x0) {
    Mtr_FreeTree(unique->tree);
  }
  if (unique->treeZ != (MtrNode *)0x0) {
    Mtr_FreeTree(unique->treeZ);
  }
  if (unique->linear != (long *)0x0) {
    free(unique->linear);
    unique->linear = (long *)0x0;
  }
  while (unique->preGCHook != (DdHook *)0x0) {
    Cudd_RemoveHook(unique,unique->preGCHook->f,CUDD_PRE_GC_HOOK);
  }
  while (unique->postGCHook != (DdHook *)0x0) {
    Cudd_RemoveHook(unique,unique->postGCHook->f,CUDD_POST_GC_HOOK);
  }
  while (unique->preReorderingHook != (DdHook *)0x0) {
    Cudd_RemoveHook(unique,unique->preReorderingHook->f,CUDD_PRE_REORDERING_HOOK);
  }
  while (unique->postReorderingHook != (DdHook *)0x0) {
    Cudd_RemoveHook(unique,unique->postReorderingHook->f,CUDD_POST_REORDERING_HOOK);
  }
  if (unique != (DdManager *)0x0) {
    free(unique);
    return;
  }
  return;
}

Assistant:

void
cuddFreeTable(
  DdManager * unique)
{
    DdNodePtr *next;
    DdNodePtr *memlist = unique->memoryList;
    int i;

    if (unique->univ != NULL) cuddZddFreeUniv(unique);
    while (memlist != NULL) {
        next = (DdNodePtr *) memlist[0];        /* link to next block */
        ABC_FREE(memlist);
        memlist = next;
    }
    unique->nextFree = NULL;
    unique->memoryList = NULL;

    for (i = 0; i < unique->size; i++) {
        ABC_FREE(unique->subtables[i].nodelist);
    }
    for (i = 0; i < unique->sizeZ; i++) {
        ABC_FREE(unique->subtableZ[i].nodelist);
    }
    ABC_FREE(unique->constants.nodelist);
    ABC_FREE(unique->subtables);
    ABC_FREE(unique->subtableZ);
    ABC_FREE(unique->acache);
    ABC_FREE(unique->perm);
    ABC_FREE(unique->permZ);
    ABC_FREE(unique->invperm);
    ABC_FREE(unique->invpermZ);
    ABC_FREE(unique->vars);
    if (unique->map != NULL) ABC_FREE(unique->map);
    ABC_FREE(unique->stack);
#ifndef DD_NO_DEATH_ROW
    ABC_FREE(unique->deathRow);
#endif
    if (unique->tree != NULL) Mtr_FreeTree(unique->tree);
    if (unique->treeZ != NULL) Mtr_FreeTree(unique->treeZ);
    if (unique->linear != NULL) ABC_FREE(unique->linear);
    while (unique->preGCHook != NULL)
        Cudd_RemoveHook(unique,unique->preGCHook->f,CUDD_PRE_GC_HOOK);
    while (unique->postGCHook != NULL)
        Cudd_RemoveHook(unique,unique->postGCHook->f,CUDD_POST_GC_HOOK);
    while (unique->preReorderingHook != NULL)
        Cudd_RemoveHook(unique,unique->preReorderingHook->f,
                        CUDD_PRE_REORDERING_HOOK);
    while (unique->postReorderingHook != NULL)
        Cudd_RemoveHook(unique,unique->postReorderingHook->f,
                        CUDD_POST_REORDERING_HOOK);
    ABC_FREE(unique);

}